

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QHttpNetworkReply::ignoreSslErrors(QHttpNetworkReply *this,QList<QSslError> *errors)

{
  long lVar1;
  QHttpNetworkConnection *this_00;
  
  lVar1 = *(long *)(*(long *)(this + 8) + 0x168);
  if (((lVar1 != 0) && (*(int *)(lVar1 + 4) != 0)) &&
     (this_00 = *(QHttpNetworkConnection **)(*(long *)(this + 8) + 0x170),
     this_00 != (QHttpNetworkConnection *)0x0)) {
    QHttpNetworkConnection::ignoreSslErrors(this_00,errors,-1);
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }